

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)

{
  endElementSAXFunc p_Var1;
  int iVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = ctxt->nameNr;
  uVar3 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    uVar6 = uVar6 + 1;
    do {
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var1 = ctxt->sax->endElement, p_Var1 != (endElementSAXFunc)0x0)) {
        (*p_Var1)(ctxt->userData,ctxt->name);
        uVar3 = (ulong)(uint)ctxt->nameNr;
      }
      iVar2 = (int)uVar3;
      if (0 < iVar2) {
        uVar5 = iVar2 - 1;
        ctxt->nameNr = uVar5;
        if (iVar2 == 1) {
          pxVar4 = (xmlChar *)0x0;
        }
        else {
          pxVar4 = ctxt->nameTab[uVar3 - 2];
        }
        ctxt->name = pxVar4;
        ctxt->nameTab[uVar5] = (xmlChar *)0x0;
        uVar3 = (ulong)uVar5;
      }
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  return;
}

Assistant:

static void
htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)
{
    int i;

    if (ctxt->nameNr == 0)
        return;
    for (i = (ctxt->nameNr - 1); i >= 0; i--) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}